

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeDropTable(Btree *p,int iTable,int *piMoved)

{
  uint uVar1;
  int *piVar2;
  BtShared *pBt;
  MemPage *pMVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  DbPage *pPg;
  MemPage *pPage;
  MemPage *local_48;
  MemPage *local_40;
  Pgno local_34;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  local_48 = (MemPage *)0x0;
  pBt = p->pBt;
  iVar4 = 0x106;
  if ((pBt->pCursor != (BtCursor *)0x0) ||
     (iVar4 = btreeGetPage(pBt,iTable,&local_48,0), iVar4 != 0)) goto LAB_00133826;
  iVar4 = sqlite3BtreeClearTable(p,iTable,(int *)0x0);
  pMVar3 = local_48;
  if (iVar4 == 0) {
    *piMoved = 0;
    if ((uint)iTable < 2) {
      zeroPage(local_48,9);
      iVar7 = 0;
      iVar4 = 0;
      if (pMVar3 == (MemPage *)0x0) goto LAB_00133826;
    }
    else {
      if (pBt->autoVacuum != '\0') {
        sqlite3BtreeGetMeta(p,4,&local_34);
        pMVar3 = local_48;
        if (local_34 == iTable) {
          iVar4 = freePage2(local_48->pBt,local_48,local_48->pgno);
          sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
          if (iVar4 != 0) goto LAB_00133826;
        }
        else {
          if (local_48 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_48->pDbPage);
          }
          iVar4 = btreeGetPage(pBt,local_34,&local_40,0);
          pMVar3 = local_40;
          if (iVar4 != 0) goto LAB_00133826;
          iVar4 = relocatePage(pBt,local_40,'\x01',0,iTable,0);
          if (pMVar3 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
          }
          if (iVar4 != 0) goto LAB_00133826;
          local_40 = (MemPage *)0x0;
          iVar4 = btreeGetPage(pBt,local_34,&local_40,0);
          pMVar3 = local_40;
          if (iVar4 != 0) {
            if (local_40 == (MemPage *)0x0) goto LAB_00133826;
            pPg = local_40->pDbPage;
            goto LAB_00133821;
          }
          iVar4 = freePage2(local_40->pBt,local_40,local_40->pgno);
          sqlite3PagerUnrefNotNull(pMVar3->pDbPage);
          if (iVar4 != 0) goto LAB_00133826;
          *piMoved = local_34;
        }
        uVar5 = (uint)sqlite3PendingByte / pBt->pageSize;
        do {
          do {
            uVar1 = local_34;
            local_34 = uVar1 - 1;
          } while ((-2 - uVar5) + local_34 == -1);
          uVar6 = 0;
          if (1 < local_34) {
            uVar1 = uVar1 - 3;
            iVar4 = uVar1 - uVar1 % (pBt->usableSize / 5 + 1);
            uVar6 = iVar4 + (uint)(iVar4 + 1U == uVar5) + 2;
          }
        } while (local_34 == uVar6);
        iVar4 = sqlite3BtreeUpdateMeta(p,4,local_34);
        goto LAB_00133826;
      }
      iVar7 = freePage2(local_48->pBt,local_48,local_48->pgno);
    }
    pPg = pMVar3->pDbPage;
    iVar4 = iVar7;
  }
  else {
    if (local_48 == (MemPage *)0x0) goto LAB_00133826;
    pPg = local_48->pDbPage;
  }
LAB_00133821:
  sqlite3PagerUnrefNotNull(pPg);
LAB_00133826:
  if (p->sharable != '\0') {
    piVar2 = &p->wantToLock;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDropTable(Btree *p, int iTable, int *piMoved){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeDropTable(p, iTable, piMoved);
  sqlite3BtreeLeave(p);
  return rc;
}